

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

void __thiscall
Lib::
DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::expand(DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint key;
  Entry *pEVar5;
  void *placement;
  Entry *pEVar6;
  Exception *this_00;
  Entry *pEVar7;
  _Head_base<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_false> local_40;
  Entry *local_38;
  
  if ((long)this->_capacityIndex < 0x1d) {
    iVar1 = *(int *)(DHMapTableCapacities + (long)this->_capacityIndex * 4 + 4);
    placement = Lib::alloc((long)iVar1 << 4);
    pEVar7 = this->_entries;
    pEVar5 = this->_afterLast;
    uVar2 = this->_timestamp;
    iVar3 = this->_capacity;
    this->_timestamp = 1;
    this->_size = 0;
    this->_deleted = 0;
    iVar4 = this->_capacityIndex;
    this->_capacityIndex = iVar4 + 1;
    this->_capacity = iVar1;
    this->_nextExpansionOccupancy = *(int *)(DHMapTableNextExpansions + (long)iVar4 * 4 + 4);
    pEVar6 = array_new<Lib::DHMap<unsigned_int,std::unique_ptr<Lib::Set<Kernel::Term*,Lib::DefaultHash>,std::default_delete<Lib::Set<Kernel::Term*,Lib::DefaultHash>>>,Lib::DefaultHash,Lib::DefaultHash2>::Entry>
                       (placement,(long)iVar1);
    this->_entries = pEVar6;
    this->_afterLast = pEVar6 + this->_capacity;
    local_38 = pEVar7;
    for (; pEVar7 != pEVar5; pEVar7 = pEVar7 + 1) {
      if (((pEVar7->field_0)._infoData & 1U) == 0 && (uint)(pEVar7->field_0)._infoData >> 2 == uVar2
         ) {
        key = pEVar7->_key;
        local_40._M_head_impl =
             (pEVar7->_val)._M_t.
             super___uniq_ptr_impl<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
             .super__Head_base<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_false>.
             _M_head_impl;
        (pEVar7->_val)._M_t.
        super___uniq_ptr_impl<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
        .super__Head_base<0UL,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_false>._M_head_impl =
             (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0;
        insert(this,key,(unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                         *)&local_40);
        std::
        unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
        ::~unique_ptr((unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                       *)&local_40);
      }
      std::
      unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
      ::~unique_ptr(&pEVar7->_val);
    }
    if (iVar3 != 0) {
      Lib::free(local_38);
    }
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x28);
  Lib::Exception::Exception(this_00,"Lib::DHMap::expand: MaxCapacityIndex reached.");
  __cxa_throw(this_00,&Lib::Exception::typeinfo,Lib::Exception::~Exception);
}

Assistant:

void expand()
  {
    if(_capacityIndex>=DHMAP_MAX_CAPACITY_INDEX) {
      throw Exception("Lib::DHMap::expand: MaxCapacityIndex reached.");
    }

    int newCapacity=DHMapTableCapacities[_capacityIndex+1];
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Entry),"DHMap::Entry");


    Entry* oldEntries=_entries;
    Entry* oldAfterLast=_afterLast;
    unsigned oldTimestamp=_timestamp;
    int oldCapacity=_capacity;

    _timestamp=1;
    _size=0;
    _deleted=0;
    _capacityIndex++;
    _capacity = newCapacity;
    _nextExpansionOccupancy = DHMapTableNextExpansions[_capacityIndex];

    _entries = array_new<Entry>(mem, _capacity);
    _afterLast = _entries + _capacity;

    Entry* ep=oldEntries;
    while(ep!=oldAfterLast) {
      ASS(ep);
      if(ep->_info.timestamp==oldTimestamp && !ep->_info.deleted) {
	insert(std::move(ep->_key), std::move(ep->_val));
      }
      (ep++)->~Entry();
    }
    if(oldCapacity) {
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Entry),"DHMap::Entry");
    }
  }